

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

void __thiscall
CCoinsViewMemPool::PackageAddTransaction(CCoinsViewMemPool *this,CTransactionRef *tx)

{
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  element_type *peVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  uint local_9c;
  undefined8 local_98;
  direct_or_indirect local_90;
  uint local_74;
  undefined4 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_9c = 0;
  peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 0;
    do {
      local_68 = *(undefined8 *)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      uStack_60 = *(undefined8 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      local_58 = *(undefined8 *)
                  ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      uStack_50 = *(undefined8 *)
                   ((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      local_48 = (undefined4)uVar2;
      other = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
              ((long)((peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar2) + 8);
      local_98 = *(undefined8 *)((long)&other[-1]._union + 0x18);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_90.indirect_contents,
                 other);
      local_70 = 0xfffffffe;
      std::
      _Hashtable<COutPoint,std::pair<COutPoint_const,Coin>,std::allocator<std::pair<COutPoint_const,Coin>>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<COutPoint,Coin>
                ((_Hashtable<COutPoint,std::pair<COutPoint_const,Coin>,std::allocator<std::pair<COutPoint_const,Coin>>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->m_temp_added,&local_68,&local_98);
      if (0x1c < local_74) {
        free(local_90.indirect_contents.indirect);
      }
      std::
      _Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_M_emplace<transaction_identifier<false>const&,unsigned_int&>
                ((_Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&this->m_non_base_coins,
                 &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->hash,&local_9c);
      local_9c = local_9c + 1;
      uVar2 = (ulong)local_9c;
      peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar3 = ((long)(peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    } while (uVar2 <= uVar3 && uVar3 - uVar2 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCoinsViewMemPool::PackageAddTransaction(const CTransactionRef& tx)
{
    for (unsigned int n = 0; n < tx->vout.size(); ++n) {
        m_temp_added.emplace(COutPoint(tx->GetHash(), n), Coin(tx->vout[n], MEMPOOL_HEIGHT, false));
        m_non_base_coins.emplace(tx->GetHash(), n);
    }
}